

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O2

Client * __thiscall
capnp::RevocableServer<capnproto_test::capnp::test::TestInterface>::getClient
          (Client *__return_storage_ptr__,
          RevocableServer<capnproto_test::capnp::test::TestInterface> *this)

{
  ClientHook *pCVar1;
  Own<capnp::ClientHook,_std::nullptr_t> local_28;
  
  (*((this->hook).ptr)->_vptr_ClientHook[4])(&local_28);
  pCVar1 = local_28.ptr;
  local_28.ptr = (ClientHook *)0x0;
  *(Disposer **)&__return_storage_ptr__->field_0x8 = local_28.disposer;
  *(ClientHook **)&__return_storage_ptr__->field_0x10 = pCVar1;
  __return_storage_ptr__->_vptr_Client = (_func_int **)&Capability::Client::typeinfo;
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_28);
  return __return_storage_ptr__;
}

Assistant:

typename T::Client RevocableServer<T>::getClient() {
  return typename T::Client(hook->addRef());
}